

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

string * __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::type_name(string *__return_storage_ptr__,
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *this)

{
  value_t vVar1;
  char *pcVar2;
  char *pcVar3;
  
  vVar1 = this->m_type;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(vVar1) {
  case null:
    pcVar3 = "null";
    pcVar2 = "";
    break;
  case object:
    pcVar3 = "object";
    pcVar2 = "";
    break;
  case array:
    pcVar3 = "array";
    pcVar2 = "";
    break;
  case string:
    pcVar3 = "string";
    pcVar2 = "";
    break;
  case boolean:
    pcVar3 = "boolean";
    pcVar2 = "";
    break;
  default:
    pcVar3 = "number";
    pcVar2 = "";
    break;
  case discarded:
    pcVar3 = "discarded";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string type_name() const
		{
			{
				switch (m_type)
				{
				case value_t::null:
					return "null";
				case value_t::object:
					return "object";
				case value_t::array:
					return "array";
				case value_t::string:
					return "string";
				case value_t::boolean:
					return "boolean";
				case value_t::discarded:
					return "discarded";
				default:
					return "number";
				}
			}
		}